

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O1

void __thiscall
pstack::Procman::MappedObject::MappedObject(MappedObject *this,string_view name,sptr *objptr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this,name._M_str,name._M_str + name._M_len);
  (this->objptr_).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (objptr->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (objptr->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (this->objptr_).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

MappedObject(std::string_view name, const Elf::Object::sptr &objptr = {})
        : name_{name}, objptr_{objptr} {}